

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O2

void G_UnSnapshotLevel(bool hubLoad)

{
  player_t *ppVar1;
  bool bVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  long *plVar5;
  int i;
  long lVar6;
  AActor *pAVar7;
  TThinkerIterator<APlayerPawn> it;
  FArchive arc;
  FThinkerIterator local_310;
  FArchive local_2f8;
  
  if ((level.info)->snapshot != (FCompressedMemFile *)0x0) {
    bVar2 = level_info_t::isValid(level.info);
    if (bVar2) {
      SaveVersion = (level.info)->snapshotVer;
      FCompressedMemFile::Reopen((level.info)->snapshot);
      FArchive::FArchive(&local_2f8,(FFile *)(level.info)->snapshot);
      if (hubLoad) {
        local_2f8.m_HubTravel = true;
      }
      G_SerializeLevel(&local_2f8,hubLoad);
      FArchive::Close(&local_2f8);
      level.FromSnapshot = true;
      TThinkerIterator<APlayerPawn>::TThinkerIterator
                ((TThinkerIterator<APlayerPawn> *)&local_310,0x80);
      pAVar3 = (AActor *)FThinkerIterator::Next(&local_310);
LAB_0045b84d:
      pAVar7 = pAVar3;
      if (pAVar7 != (AActor *)0x0) {
        pAVar3 = (AActor *)FThinkerIterator::Next(&local_310);
        ppVar1 = pAVar7->player;
        if (((ppVar1 == (player_t *)0x0) || (ppVar1->mo == (APlayerPawn *)0x0)) ||
           (playeringame[(long)(ppVar1[-0x3b4b].frags + 7) / 0x2a0] == false)) {
          plVar5 = &players;
          for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
            if ((playeringame[lVar6] == true) && ((int)plVar5[0x28] != 0)) {
              pAVar4 = GC::ReadBarrier<AActor>((AActor **)(*plVar5 + 0x248));
              if (pAVar4 == pAVar7) goto LAB_0045b84d;
            }
            plVar5 = plVar5 + 0x54;
          }
          (*(pAVar7->super_DThinker).super_DObject._vptr_DObject[4])(pAVar7);
        }
        goto LAB_0045b84d;
      }
      FArchive::~FArchive(&local_2f8);
    }
    level_info_t::ClearSnapshot(level.info);
    if (hubLoad) {
      FBehavior::StaticUnlockLevelVarStrings();
    }
  }
  return;
}

Assistant:

void G_UnSnapshotLevel (bool hubLoad)
{
	if (level.info->snapshot == NULL)
		return;

	if (level.info->isValid())
	{
		SaveVersion = level.info->snapshotVer;
		level.info->snapshot->Reopen ();
		FArchive arc (*level.info->snapshot);
		if (hubLoad)
			arc.SetHubTravel ();
		G_SerializeLevel (arc, hubLoad);
		arc.Close ();
		level.FromSnapshot = true;

		TThinkerIterator<APlayerPawn> it;
		APlayerPawn *pawn, *next;

		next = it.Next();
		while ((pawn = next) != 0)
		{
			next = it.Next();
			if (pawn->player == NULL || pawn->player->mo == NULL || !playeringame[pawn->player - players])
			{
				int i;

				// If this isn't the unmorphed original copy of a player, destroy it, because it's extra.
				for (i = 0; i < MAXPLAYERS; ++i)
				{
					if (playeringame[i] && players[i].morphTics && players[i].mo->tracer == pawn)
					{
						break;
					}
				}
				if (i == MAXPLAYERS)
				{
					pawn->Destroy ();
				}
			}
		}
	}
	// No reason to keep the snapshot around once the level's been entered.
	level.info->ClearSnapshot();
	if (hubLoad)
	{
		// Unlock ACS global strings that were locked when the snapshot was made.
		FBehavior::StaticUnlockLevelVarStrings();
	}
}